

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void addStaticRoot(object **objp)

{
  long lVar1;
  int local_14;
  int i;
  object **objp_local;
  
  local_14 = 0;
  while( true ) {
    if (staticRootTop <= local_14) {
      if (199 < staticRootTop) {
        error_impl("addStaticRoot",0x189,
                   "addStaticRoot(): too many static references (max %d) to store object %p!",200,
                   objp);
      }
      lVar1 = (long)staticRootTop;
      staticRootTop = staticRootTop + 1;
      staticRoots[lVar1] = objp;
      return;
    }
    if (objp == staticRoots[local_14]) break;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void addStaticRoot(struct object **objp)
{
    int i;

    for (i = 0; i < staticRootTop; ++i) {
        if (objp == staticRoots[i]) {
            return;
        }
    }
    if (staticRootTop >= STATICROOTLIMIT) {
        error("addStaticRoot(): too many static references (max %d) to store object %p!", STATICROOTLIMIT, objp);
    }
    staticRoots[staticRootTop++] = objp;
}